

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

void __thiscall gvr::PLYWriter::writeHeader(PLYWriter *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  size_type sVar4;
  reference ppPVar5;
  long lVar6;
  int *in_RDI;
  bool bVar7;
  PLYProperty *in_stack_00000078;
  int k;
  size_t i;
  PLYElement *in_stack_000000e8;
  undefined8 in_stack_ffffffffffffff28;
  ulong uVar8;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string local_60 [32];
  int local_40;
  string local_30 [32];
  ulong local_10;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    poVar3 = std::operator<<((ostream *)(in_RDI + 0x12),"ply");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)(in_RDI + 0x12),"format ");
    iVar2 = *in_RDI;
    if (iVar2 == 0) {
      std::operator<<((ostream *)(in_RDI + 0x12),"ascii ");
    }
    else if (iVar2 == 2) {
      std::operator<<((ostream *)(in_RDI + 0x12),"binary_big_endian ");
    }
    else if (iVar2 == 3) {
      std::operator<<((ostream *)(in_RDI + 0x12),"binary_little_endian ");
    }
    poVar3 = std::operator<<((ostream *)(in_RDI + 0x12),"1.0");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (local_10 = 0; uVar8 = local_10,
        sVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 2)), uVar8 < sVar4; local_10 = local_10 + 1) {
      ppPVar5 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 2),local_10);
      *(value_type *)(in_RDI + 10) = *ppPVar5;
      PLYElement::toString_abi_cxx11_(in_stack_000000e8);
      poVar3 = std::operator<<((ostream *)(in_RDI + 0x12),local_30);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_30);
      lVar6 = PLYElement::getInstances(*(PLYElement **)(in_RDI + 10));
      if (0 < lVar6) {
        for (local_40 = 0; iVar2 = local_40,
            iVar1 = PLYElement::getPropertyCount((PLYElement *)0x124973), iVar2 < iVar1;
            local_40 = local_40 + 1) {
          PLYElement::getProperty
                    ((PLYElement *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                     (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          (anonymous_namespace)::PLYProperty::toString_abi_cxx11_(in_stack_00000078);
          poVar3 = std::operator<<((ostream *)(in_RDI + 0x12),local_60);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_60);
        }
      }
    }
    poVar3 = std::operator<<((ostream *)(in_RDI + 0x12),"end_header");
    std::operator<<(poVar3,"\n");
    *(undefined1 *)(in_RDI + 8) = 1;
    in_RDI[10] = 0;
    in_RDI[0xb] = 0;
    in_RDI[0xc] = 0;
    in_RDI[0xd] = 0;
    while( true ) {
      uVar8 = *(ulong *)(in_RDI + 0xc);
      sVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                        ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                         (in_RDI + 2));
      bVar7 = false;
      if (uVar8 < sVar4) {
        ppPVar5 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                            ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                             (in_RDI + 2),*(size_type *)(in_RDI + 0xc));
        lVar6 = PLYElement::getInstances(*ppPVar5);
        bVar7 = true;
        if (0 < lVar6) {
          std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                    ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)(in_RDI + 2),
                     *(size_type *)(in_RDI + 0xc));
          iVar2 = PLYElement::getPropertyCount((PLYElement *)0x124b13);
          bVar7 = iVar2 == 0;
        }
      }
      if (!bVar7) break;
      *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 1;
    }
    in_RDI[0xe] = 1;
    in_RDI[0xf] = 0;
    in_RDI[0x10] = 1;
    in_RDI[0x11] = 0;
    uVar8 = *(ulong *)(in_RDI + 0xc);
    sVar4 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::size
                      ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)(in_RDI + 2)
                      );
    if (uVar8 < sVar4) {
      ppPVar5 = std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::operator[]
                          ((vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_> *)
                           (in_RDI + 2),*(size_type *)(in_RDI + 0xc));
      *(value_type *)(in_RDI + 10) = *ppPVar5;
      lVar6 = PLYElement::getInstances(*(PLYElement **)(in_RDI + 10));
      *(long *)(in_RDI + 0xe) = lVar6;
      iVar2 = PLYElement::getPropertyCount((PLYElement *)0x124bbf);
      in_RDI[0x10] = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void PLYWriter::writeHeader()
{
  if (!header_complete)
  {
    // write magic code

    out << "ply" << std::endl;

    // write encoding and version

    out << "format ";

    switch (enc)
    {
      case ply_ascii:
        out << "ascii ";
        break;

      case ply_big_endian:
        out << "binary_big_endian ";
        break;

      case ply_little_endian:
        out << "binary_little_endian ";
        break;

      default:
        break;
    }

    out << "1.0" << std::endl;

    // write all comments and elements

    for (size_t i=0; i<list.size(); i++)
    {
      element=list[i];

      out << element->toString() << std::endl;

      if (element->getInstances() > 0)
      {
        // write properties

        for (int k=0; k<element->getPropertyCount(); k++)
        {
          out << element->getProperty(k).toString() << std::endl;
        }
      }
    }

    out << "end_header" << "\n";

    header_complete=true;

    // set element pointer to first element with one or more properties and
    // one or more instances

    element=0;

    pelem=0;

    while (pelem < list.size() && (list[pelem]->getInstances() <= 0 ||
                                   list[pelem]->getPropertyCount() == 0))
    {
      pelem++;
    }

    pinst=1;
    pprop=1;
    plist=0;

    if (pelem < list.size())
    {
      element=list[pelem];
      pinst=element->getInstances();
      pprop=element->getPropertyCount()+1;
    }
  }
}